

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmersenne.h
# Opt level: O2

int __thiscall CVmMT19937::rand(CVmMT19937 *this)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = this->idx;
  if (0x26f < iVar1) {
    generate_untempered(this);
    this->idx = 0;
    iVar1 = 0;
  }
  uVar2 = this->mt[iVar1] >> 0xb ^ this->mt[iVar1];
  uVar2 = (uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = (uVar2 & 0x1df8c) << 0xf ^ uVar2;
  this->idx = iVar1 + 1;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

uint32_t rand()
    {
        /* if we're out of untempered numbers, generate the next set */
        if (idx >= NMT)
        {
            generate_untempered();
            idx = 0;
        }

        /* generate a tempered result */
        uint32_t y = mt[idx];
        y ^= (y >> 11);
        y ^= ((y << 7) & 0x9d2c5680);
        y ^= ((y << 15) & 0xefc60000);
        y ^= (y >> 18);

        /* on to the next index */
        ++idx;

        /* return the result */
        return y;
    }